

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O1

void __thiscall
ft::list<ft::pair<int,_int>,_ft::allocator<ft::pair<int,_int>_>_>::clear
          (list<ft::pair<int,_int>,_ft::allocator<ft::pair<int,_int>_>_> *this)

{
  size_type *psVar1;
  size_type sVar2;
  node *pnVar3;
  listNode<ft::pair<int,_int>_> *plVar4;
  listNode<ft::pair<int,_int>_> *plVar5;
  
  sVar2 = this->m_size;
  while (sVar2 != 0) {
    pnVar3 = this->m_tail;
    plVar4 = pnVar3->prev;
    plVar5 = plVar4->prev;
    pnVar3->prev = plVar5;
    plVar5->next = pnVar3;
    operator_delete(plVar4);
    psVar1 = &this->m_size;
    *psVar1 = *psVar1 - 1;
    sVar2 = *psVar1;
  }
  return;
}

Assistant:

bool 		empty() const { return this->size() == 0; }